

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void Curl_expire_latest(Curl_easy *data,time_t milli)

{
  timeval *ptVar1;
  long lVar2;
  time_t tVar3;
  long lVar4;
  timeval tVar5;
  
  tVar5 = curlx_tvnow();
  ptVar1 = &(data->state).expiretime;
  if (ptVar1->tv_sec != 0 || (data->state).expiretime.tv_usec != 0) {
    lVar4 = (milli % 1000) * 1000;
    lVar2 = tVar5.tv_usec + lVar4;
    lVar4 = tVar5.tv_usec + -1000000 + lVar4;
    if (lVar2 < 1000000) {
      lVar4 = lVar2;
    }
    tVar5.tv_sec = (ulong)(999999 < lVar2) + tVar5.tv_sec + milli / 1000;
    tVar5.tv_usec = lVar4;
    tVar3 = curlx_tvdiff(tVar5,*ptVar1);
    if (0 < tVar3) {
      return;
    }
  }
  Curl_expire(data,milli);
  return;
}

Assistant:

void Curl_expire_latest(struct Curl_easy *data, time_t milli)
{
  struct timeval *expire = &data->state.expiretime;

  struct timeval set;

  set = Curl_tvnow();
  set.tv_sec += (long)(milli / 1000);
  set.tv_usec += (milli % 1000) * 1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  if(expire->tv_sec || expire->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
         is. */
    time_t diff = curlx_tvdiff(set, *expire);
    if(diff > 0)
      /* the new expire time was later than the top time, so just skip this */
      return;
  }

  /* Just add the timeout like normal */
  Curl_expire(data, milli);
}